

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11wm.cpp
# Opt level: O0

void __thiscall rw::X11WM::move_resize_window(X11WM *this,Window *window,int x,int y,uint w,uint h)

{
  int iVar1;
  ostream *this_00;
  unsigned_long gravity_flags;
  long mask;
  XEvent event;
  uint h_local;
  uint w_local;
  int y_local;
  int x_local;
  Window *window_local;
  X11WM *this_local;
  
  event.xcookie.data = (void *)0x2f00;
  mask._0_4_ = 0x21;
  event.pad[0] = 0;
  event.xany.serial._0_4_ = 1;
  event.xany.window = this->_NET_MOVERESIZE_WINDOW;
  event.xany.display = (Display *)(long)window->window_id;
  event.xfocus.mode = 0x20;
  event.xkey.time = (Time)x;
  event.xselectionrequest.property = (Atom)y;
  event.xconfigure.above = (Window)w;
  event.pad[10] = (long)h;
  event.pad[0x17]._0_4_ = h;
  event.pad[0x17]._4_4_ = w;
  h_local = y;
  w_local = x;
  _y_local = window;
  window_local = (Window *)this;
  iVar1 = XSendEvent(this->display,this->root_window,0,0x180000,&mask);
  if (iVar1 == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "Could not send event to move and resize the window.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  return;
}

Assistant:

void X11WM::move_resize_window(const Window * window, int x, int y, unsigned int w, unsigned int h) {
        XEvent event;
        long mask = SubstructureRedirectMask | SubstructureNotifyMask;

        unsigned long gravity_flags = 0;
        // All x, y, w and h are set
        gravity_flags |= (1 << 8);
        gravity_flags |= (1 << 9);
        gravity_flags |= (1 << 10);
        gravity_flags |= (1 << 11);
        gravity_flags |= (1 << 13);

        event.xclient.type = ClientMessage;
        event.xclient.serial = 0;
        event.xclient.send_event = True;
        event.xclient.message_type = _NET_MOVERESIZE_WINDOW;
        event.xclient.window = window->window_id;
        event.xclient.format = 32;
        event.xclient.data.l[0] = (unsigned long) gravity_flags;
        event.xclient.data.l[1] = (unsigned long) x;
        event.xclient.data.l[2] = (unsigned long) y;
        event.xclient.data.l[3] = (unsigned long) w;
        event.xclient.data.l[4] = (unsigned long) h;

        if (!XSendEvent(display, root_window, False, mask, &event)) {
            cerr << "Could not send event to move and resize the window." << endl;
            exit(2);
        }
    }